

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rtreenode(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  uint uVar1;
  i64 iVar2;
  u8 *puVar3;
  sqlite3_str *p;
  char *z;
  ulong uVar4;
  byte bVar5;
  RtreeNode node;
  RtreeCell cell;
  Rtree tree;
  
  node.pParent = (RtreeNode *)0x0;
  node.iNode = 0;
  node.nRef = 0;
  node.isDirty = 0;
  node.zData = (u8 *)0x0;
  node.pNext = (RtreeNode *)0x0;
  memset(&tree,0,0x3c8);
  iVar2 = sqlite3VdbeIntValue(*apArg);
  tree.nDim = (u8)iVar2;
  if (0xfffffffa < ((uint)iVar2 & 0xff) - 6) {
    tree.nDim2 = tree.nDim * '\x02';
    bVar5 = tree.nDim * '\b' + 8;
    tree.nBytesPerCell = bVar5;
    puVar3 = (u8 *)sqlite3_value_blob(apArg[1]);
    node.zData = puVar3;
    uVar1 = sqlite3_value_bytes(apArg[1]);
    if ((3 < (int)uVar1) &&
       ((uint)bVar5 * (uint)(ushort)(*(ushort *)(puVar3 + 2) << 8 | *(ushort *)(puVar3 + 2) >> 8) <=
        uVar1)) {
      p = sqlite3_str_new((sqlite3 *)0x0);
      for (uVar1 = 0; uVar1 < (ushort)(*(ushort *)(puVar3 + 2) << 8 | *(ushort *)(puVar3 + 2) >> 8);
          uVar1 = uVar1 + 1) {
        nodeGetCell(&tree,&node,uVar1,&cell);
        if (uVar1 != 0) {
          sqlite3_str_append(p," ",1);
        }
        sqlite3_str_appendf(p,"{%lld",cell.iRowid);
        for (uVar4 = 0; ((uint)iVar2 & 0x7f) << 3 != uVar4; uVar4 = uVar4 + 4) {
          sqlite3_str_appendf(p," %g",SUB84((double)*(float *)((long)cell.aCoord + uVar4),0));
        }
        sqlite3_str_append(p,"}",1);
      }
      if (p == (sqlite3_str *)0x0) {
        uVar1 = 7;
      }
      else {
        uVar1 = (uint)p->accError;
      }
      z = sqlite3_str_finish(p);
      sqlite3_result_text(ctx,z,-1,sqlite3_free);
      sqlite3_result_error_code(ctx,uVar1);
      return;
    }
  }
  return;
}

Assistant:

static void rtreenode(sqlite3_context *ctx, int nArg, sqlite3_value **apArg){
  RtreeNode node;
  Rtree tree;
  int ii;
  int nData;
  int errCode;
  sqlite3_str *pOut;

  UNUSED_PARAMETER(nArg);
  memset(&node, 0, sizeof(RtreeNode));
  memset(&tree, 0, sizeof(Rtree));
  tree.nDim = (u8)sqlite3_value_int(apArg[0]);
  if( tree.nDim<1 || tree.nDim>5 ) return;
  tree.nDim2 = tree.nDim*2;
  tree.nBytesPerCell = 8 + 8 * tree.nDim;
  node.zData = (u8 *)sqlite3_value_blob(apArg[1]);
  nData = sqlite3_value_bytes(apArg[1]);
  if( nData<4 ) return;
  if( nData<NCELL(&node)*tree.nBytesPerCell ) return;

  pOut = sqlite3_str_new(0);
  for(ii=0; ii<NCELL(&node); ii++){
    RtreeCell cell;
    int jj;

    nodeGetCell(&tree, &node, ii, &cell);
    if( ii>0 ) sqlite3_str_append(pOut, " ", 1);
    sqlite3_str_appendf(pOut, "{%lld", cell.iRowid);
    for(jj=0; jj<tree.nDim2; jj++){
#ifndef SQLITE_RTREE_INT_ONLY
      sqlite3_str_appendf(pOut, " %g", (double)cell.aCoord[jj].f);
#else
      sqlite3_str_appendf(pOut, " %d", cell.aCoord[jj].i);
#endif
    }
    sqlite3_str_append(pOut, "}", 1);
  }
  errCode = sqlite3_str_errcode(pOut);
  sqlite3_result_text(ctx, sqlite3_str_finish(pOut), -1, sqlite3_free);
  sqlite3_result_error_code(ctx, errCode);
}